

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void make_pred(update_data_conflict *data,float x,float *wref)

{
  int iVar1;
  float *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  double dVar2;
  int i;
  float *w;
  int m;
  int local_2c;
  float local_c;
  
  iVar1 = *(int *)(*in_RDI + 8);
  local_c = in_XMM0_Da;
  if ((*(byte *)(*in_RDI + 0xac) & 1) != 0) {
    dVar2 = std::sqrt((double)(ulong)(uint)in_RSI[iVar1 + 1]);
    local_c = in_XMM0_Da / SUB84(dVar2,0);
  }
  *(float *)((long)in_RDI + 0x34) = *in_RSI * local_c + *(float *)((long)in_RDI + 0x34);
  for (local_2c = 1; local_2c <= iVar1; local_2c = local_2c + 1) {
    *(float *)((long)in_RDI + 0x34) =
         in_RSI[local_2c] * local_c * *(float *)(*(long *)(*in_RDI + 0x30) + (long)local_2c * 4) *
         *(float *)(*(long *)(*in_RDI + 0x28) + (long)local_2c * 4) +
         *(float *)((long)in_RDI + 0x34);
  }
  return;
}

Assistant:

void make_pred(update_data& data, float x, float& wref)
{
  int m = data.ON->m;
  float* w = &wref;

  if (data.ON->normalize)
  {
    x /= sqrt(w[NORM2]);
  }

  data.prediction += w[0] * x;
  for (int i = 1; i <= m; i++)
  {
    data.prediction += w[i] * x * data.ON->D[i] * data.ON->b[i];
  }
}